

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chunk.cpp
# Opt level: O0

void __thiscall Chunk::deserialize(Chunk *this,vector<char,_std::allocator<char>_> *data)

{
  char *pcVar1;
  bitset<4UL> *in_RSI;
  long in_RDI;
  uint32_t tileSwapped;
  uint i;
  uint32_t in_stack_ffffffffffffffe8;
  uint uVar2;
  
  for (uVar2 = 0; uVar2 < 0x400; uVar2 = uVar2 + 1) {
    pcVar1 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)0x272324);
    in_stack_ffffffffffffffe8 =
         FileStorage::byteswap<unsigned_int,_true>(*(uint32_t *)(pcVar1 + (ulong)uVar2 * 4));
    *(uint32_t *)(in_RDI + (ulong)uVar2 * 4) = in_stack_ffffffffffffffe8;
  }
  std::bitset<4UL>::set
            (in_RSI,CONCAT44(uVar2,in_stack_ffffffffffffffe8),SUB81((ulong)in_RDI >> 0x38,0));
  std::bitset<4UL>::set
            (in_RSI,CONCAT44(uVar2,in_stack_ffffffffffffffe8),SUB81((ulong)in_RDI >> 0x38,0));
  return;
}

Assistant:

void Chunk::deserialize(const std::vector<char>& data) {
    assert(data.size() == sizeof(tiles_));
    for (unsigned int i = 0; i < WIDTH * WIDTH; ++i) {
        uint32_t tileSwapped;
        std::memcpy(&tileSwapped, data.data() + i * sizeof(TileData), sizeof(TileData));
        tileSwapped = FileStorage::byteswap(tileSwapped);
        tiles_[i] = *reinterpret_cast<TileData*>(&tileSwapped);
    }
    dirtyFlags_.set(ChunkDirtyFlag::emptyIsStale);
    dirtyFlags_.set(ChunkDirtyFlag::highlightedIsStale);
}